

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_pool_2d(ggml_context *ctx,ggml_tensor *a,ggml_op_pool op,int k0,int k1,int s0,int s1,float p0,
            float p1)

{
  ggml_tensor *tensor;
  float in_XMM0_Db;
  float in_XMM1_Db;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM4_Db;
  ggml_op_pool local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  undefined8 local_64;
  long local_58;
  long lStack_50;
  int64_t local_48;
  int64_t iStack_40;
  
  auVar2._0_4_ = (float)s0;
  auVar2._4_4_ = (float)s1;
  auVar2._8_8_ = 0;
  auVar1._0_4_ = (p0 + p0 + (float)a->ne[0]) - (float)k0;
  auVar1._4_4_ = (p1 + p1 + (float)a->ne[1]) - (float)k1;
  auVar1._8_4_ = (in_XMM0_Db + in_XMM0_Db + in_XMM4_Db) - 0.0;
  auVar1._12_4_ = (in_XMM1_Db + in_XMM1_Db + (float)s1) - 0.0;
  auVar1 = divps(auVar1,auVar2);
  local_58 = (long)(auVar1._0_4_ + 1.0);
  lStack_50 = (long)(auVar1._4_4_ + 1.0);
  local_48 = a->ne[2];
  iStack_40 = a->ne[3];
  tensor = ggml_new_tensor(ctx,GGML_TYPE_F32,4,&local_58);
  local_68 = s1;
  local_64 = CONCAT44((int)p1,(int)p0);
  local_78 = op;
  local_74 = k0;
  local_70 = k1;
  local_6c = s0;
  ggml_set_op_params(tensor,&local_78,0x1c);
  tensor->op = GGML_OP_POOL_2D;
  tensor->src[0] = a;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_pool_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum ggml_op_pool     op,
        int                   k0,
        int                   k1,
        int                   s0,
        int                   s1,
        float                 p0,
        float                 p1) {
    struct ggml_tensor * result;
    const int64_t ne[4] = {
        ggml_calc_pool_output_size(a->ne[0], k0, s0, p0),
        ggml_calc_pool_output_size(a->ne[1], k1, s1, p1),
        a->ne[2],
        a->ne[3],
    };
    result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { op, k0, k1, s0, s1, p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_2D;
    result->src[0] = a;

    return result;
}